

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::~QGraphicsWidget(QWindow *this)

{
  QGraphicsWidget *pQVar1;
  bool bVar2;
  QGraphicsWidgetPrivate *pQVar3;
  QGraphicsScene *pQVar4;
  QGraphicsScenePrivate *pQVar5;
  QGraphicsWidgetPrivate *pQVar6;
  const_iterator o;
  QGraphicsItem **ppQVar7;
  QGraphicsLayoutItem *pQVar8;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QWindow *widget;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range2;
  QGraphicsLayout *temp;
  QGraphicsScenePrivate *sceneD;
  QGraphicsScene *scn;
  QActionPrivate *apriv;
  QAction *action;
  add_const_t<QList<QAction_*>_> *__range1;
  QGraphicsWidgetPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsItem_*> items;
  const_iterator __end1;
  const_iterator __begin1;
  QGraphicsLayoutItem *in_stack_ffffffffffffff08;
  QGraphicsLayoutItem *in_stack_ffffffffffffff10;
  QGraphicsObject *this_00;
  QGraphicsItem *in_stack_ffffffffffffff18;
  QGraphicsItem *pQVar9;
  QGraphicsItem *in_stack_ffffffffffffff20;
  QGraphicsItem *in_stack_ffffffffffffff28;
  QGraphicsItem *pQVar10;
  QGraphicsWidget *local_c0;
  QGraphicsItem *in_stack_ffffffffffffff58;
  const_iterator local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QAction **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&in_RDI->super_QGraphicsObject = &PTR_metaObject_00d35ab0;
  (in_RDI->super_QGraphicsObject).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsWidget_00d35c18;
  (in_RDI->super_QGraphicsLayoutItem)._vptr_QGraphicsLayoutItem =
       (_func_int **)&PTR__QGraphicsWidget_00d35d50;
  pQVar3 = d_func((QGraphicsWidget *)0xa4a766);
  local_10.i = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QAction_*>::begin((QList<QAction_*> *)in_stack_ffffffffffffff10);
  local_18.i = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QAction_*>::end((QList<QAction_*> *)in_stack_ffffffffffffff10);
  while( true ) {
    local_20 = local_18.i;
    bVar2 = QList<QAction_*>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar2) break;
    QList<QAction_*>::const_iterator::operator*(&local_10);
    QAction::d_func((QAction *)0xa4a82e);
    QList<QObject*>::removeAll<QGraphicsWidget*>
              ((QList<QObject_*> *)in_stack_ffffffffffffff10,(QWindow **)in_stack_ffffffffffffff08);
    QList<QAction_*>::const_iterator::operator++(&local_10);
  }
  QList<QAction_*>::clear((QList<QAction_*> *)in_stack_ffffffffffffff10);
  pQVar4 = QGraphicsItem::scene((QGraphicsItem *)0xa4a890);
  if ((pQVar4 != (QGraphicsScene *)0x0) &&
     (pQVar5 = QGraphicsScene::d_func((QGraphicsScene *)0xa4a8a7), pQVar5->tabFocusFirst == in_RDI))
  {
    if (pQVar3->focusNext == in_RDI) {
      local_c0 = (QGraphicsWidget *)0x0;
    }
    else {
      local_c0 = pQVar3->focusNext;
    }
    pQVar5->tabFocusFirst = local_c0;
  }
  pQVar1 = pQVar3->focusNext;
  pQVar6 = d_func((QGraphicsWidget *)0xa4a92d);
  pQVar6->focusNext = pQVar1;
  pQVar1 = pQVar3->focusPrev;
  pQVar6 = d_func((QGraphicsWidget *)0xa4a961);
  pQVar6->focusPrev = pQVar1;
  pQVar3->focusNext = in_RDI;
  pQVar3->focusPrev = in_RDI;
  QGraphicsItem::clearFocus((QGraphicsItem *)0xa4a999);
  if (pQVar3->layout != (QGraphicsLayout *)0x0) {
    pQVar9 = (QGraphicsItem *)pQVar3->layout;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::childItems(in_stack_ffffffffffffff18);
    local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff10);
    o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff10);
    while (bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_48,o), bVar2) {
      ppQVar7 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_48);
      pQVar10 = *ppQVar7;
      bVar2 = QGraphicsItem::isWidget((QGraphicsItem *)0xa4aab1);
      in_stack_ffffffffffffff58 = pQVar10;
      if (bVar2) {
        if (pQVar10 == (QGraphicsItem *)0x0) {
          in_stack_ffffffffffffff20 = (QGraphicsItem *)0x0;
        }
        else {
          in_stack_ffffffffffffff20 = pQVar10 + -1;
        }
        pQVar8 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0xa4aaf8);
        in_stack_ffffffffffffff28 = pQVar10;
        if (pQVar8 == &pQVar3->layout->super_QGraphicsLayoutItem) {
          QGraphicsLayoutItem::setParentLayoutItem
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff28 = pQVar10;
        }
      }
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_48);
    }
    pQVar3->layout = (QGraphicsLayout *)0x0;
    in_stack_ffffffffffffff18 = pQVar9;
    if (pQVar9 != (QGraphicsItem *)0x0) {
      (*((QGraphicsLayoutItem *)&pQVar9->_vptr_QGraphicsItem)->_vptr_QGraphicsLayoutItem[1])();
      in_stack_ffffffffffffff18 = pQVar9;
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa4ab6c);
  }
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_> *)
             in_stack_ffffffffffffff08);
  this_00 = (QGraphicsObject *)0x0;
  QGraphicsWidgetStyles::setStyleForWidget
            ((QGraphicsWidgetStyles *)in_stack_ffffffffffffff20,(QWindow *)in_stack_ffffffffffffff28
             ,(QStyle *)in_stack_ffffffffffffff18);
  QGraphicsItem::setParentItem(in_stack_ffffffffffffff28,in_stack_ffffffffffffff58);
  QGraphicsLayoutItem::~QGraphicsLayoutItem((QGraphicsLayoutItem *)in_stack_ffffffffffffff20);
  QGraphicsObject::~QGraphicsObject(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGraphicsWidget::~QGraphicsWidget()
{
    Q_D(QGraphicsWidget);
#ifndef QT_NO_ACTION
    // Remove all actions from this widget
    for (auto action : std::as_const(d->actions)) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.removeAll(this);
    }
    d->actions.clear();
#endif

    if (QGraphicsScene *scn = scene()) {
        QGraphicsScenePrivate *sceneD = scn->d_func();
        if (sceneD->tabFocusFirst == this)
            sceneD->tabFocusFirst = (d->focusNext == this ? nullptr : d->focusNext);
    }
    d->focusPrev->d_func()->focusNext = d->focusNext;
    d->focusNext->d_func()->focusPrev = d->focusPrev;

    // Play it really safe
    d->focusNext = this;
    d->focusPrev = this;

    clearFocus();

    //we check if we have a layout previously
    if (d->layout) {
        QGraphicsLayout *temp = d->layout;
        const auto items = childItems();
        for (QGraphicsItem *item : items) {
            // In case of a custom layout which doesn't remove and delete items, we ensure that
            // the parent layout item does not point to the deleted layout. This code is here to
            // avoid regression from 4.4 to 4.5, because according to 4.5 docs it is not really needed.
            if (item->isWidget()) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
                if (widget->parentLayoutItem() == d->layout)
                    widget->setParentLayoutItem(nullptr);
            }
        }
        d->layout = nullptr;
        delete temp;
    }

    // Remove this graphics widget from widgetStyles
    widgetStyles()->setStyleForWidget(this, nullptr);

    // Unset the parent here, when we're still a QGraphicsWidget.
    // It is otherwise done in ~QGraphicsItem() where we'd be
    // calling QGraphicsWidget members on an ex-QGraphicsWidget object
    setParentItem(nullptr);
}